

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

_Bool duckdb_je_pac_maybe_decay_purge
                (tsdn_t *tsdn,pac_t *pac,decay_t *decay,pac_decay_stats_t *decay_stats,
                ecache_t *ecache,pac_purge_eagerness_t eagerness)

{
  long lVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  ulong npages_current;
  ulong npages_limit;
  nstime_t time;
  
  lVar1 = (decay->time_ms).repr;
  if (lVar1 < 1) {
    if (lVar1 != 0) {
      return false;
    }
    sVar3 = duckdb_je_eset_npages_get(&ecache->eset);
    sVar4 = duckdb_je_eset_npages_get(&ecache->guarded_eset);
    sVar4 = sVar4 + sVar3;
    _Var2 = false;
    npages_limit = 0;
  }
  else {
    duckdb_je_nstime_init_update(&time);
    sVar3 = duckdb_je_eset_npages_get(&ecache->eset);
    sVar4 = duckdb_je_eset_npages_get(&ecache->guarded_eset);
    npages_current = sVar4 + sVar3;
    _Var2 = duckdb_je_decay_maybe_advance_epoch(decay,&time,npages_current);
    if ((eagerness != PAC_PURGE_ON_EPOCH_ADVANCE || !_Var2) && eagerness != PAC_PURGE_ALWAYS) {
      return _Var2;
    }
    npages_limit = decay->npages_limit;
    sVar4 = npages_current - npages_limit;
    if (npages_current < npages_limit || sVar4 == 0) {
      return _Var2;
    }
  }
  pac_decay_to_limit(tsdn,pac,decay,decay_stats,ecache,false,npages_limit,sVar4);
  return _Var2;
}

Assistant:

bool
pac_maybe_decay_purge(tsdn_t *tsdn, pac_t *pac, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache,
    pac_purge_eagerness_t eagerness) {
	malloc_mutex_assert_owner(tsdn, &decay->mtx);

	/* Purge all or nothing if the option is disabled. */
	ssize_t decay_ms = decay_ms_read(decay);
	if (decay_ms <= 0) {
		if (decay_ms == 0) {
			pac_decay_to_limit(tsdn, pac, decay, decay_stats,
			    ecache, /* fully_decay */ false,
			    /* npages_limit */ 0, ecache_npages_get(ecache));
		}
		return false;
	}

	/*
	 * If the deadline has been reached, advance to the current epoch and
	 * purge to the new limit if necessary.  Note that dirty pages created
	 * during the current epoch are not subject to purge until a future
	 * epoch, so as a result purging only happens during epoch advances, or
	 * being triggered by background threads (scheduled event).
	 */
	nstime_t time;
	nstime_init_update(&time);
	size_t npages_current = ecache_npages_get(ecache);
	bool epoch_advanced = decay_maybe_advance_epoch(decay, &time,
	    npages_current);
	if (eagerness == PAC_PURGE_ALWAYS
	    || (epoch_advanced && eagerness == PAC_PURGE_ON_EPOCH_ADVANCE)) {
		size_t npages_limit = decay_npages_limit_get(decay);
		pac_decay_try_purge(tsdn, pac, decay, decay_stats, ecache,
		    npages_current, npages_limit);
	}

	return epoch_advanced;
}